

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::remove_time_critical_piece
          (torrent *this,piece_index_t piece,bool finished)

{
  byte bVar1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  int iVar2;
  int iVar3;
  time_point tVar4;
  undefined4 extraout_var;
  int iVar5;
  int iVar6;
  const_iterator __position;
  piece_index_t piece_local;
  undefined1 local_50 [20];
  undefined1 local_3c;
  generic_error_category *local_38;
  
  __position._M_current =
       (this->m_time_critical_pieces).
       super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->m_time_critical_pieces).
        super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (((__position._M_current)->piece).m_val == piece.m_val) break;
    __position._M_current = __position._M_current + 1;
  }
  bVar1 = ((__position._M_current)->flags).m_val;
  piece_local.m_val = piece.m_val;
  if (finished) {
    if ((bVar1 & 1) != 0) {
      read_piece(this,piece);
    }
    tVar4 = time_now();
    iVar5 = (int)(((long)tVar4.__d.__r - ((__position._M_current)->first_requested).__d.__r) /
                 1000000);
    iVar3 = this->m_average_piece_time;
    if (iVar3 != 0) {
      iVar6 = iVar5 - iVar3;
      iVar2 = -iVar6;
      if (0 < iVar6) {
        iVar2 = iVar6;
      }
      if (this->m_piece_time_deviation != 0) {
        iVar2 = (this->m_piece_time_deviation * 9 + iVar2) / 10;
      }
      this->m_piece_time_deviation = iVar2;
      iVar5 = (iVar3 * 9 + iVar5) / 10;
    }
    this->m_average_piece_time = iVar5;
  }
  else if ((bVar1 & 1) != 0) {
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_50);
    local_50._16_4_ = 0x7d;
    local_3c = boost::system::detail::failed_impl
                         (0x7d,&boost::system::detail::cat_holder<void>::generic_category_instance.
                                super_error_category);
    local_38 = &boost::system::detail::cat_holder<void>::generic_category_instance;
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
              ((alert_manager *)CONCAT44(extraout_var,iVar3),(torrent_handle *)local_50,&piece_local
               ,(error_code *)(local_50 + 0x10));
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  }
  this_00._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (piece_picker *)0x0) {
    piece_picker::set_piece_priority(this_00._M_head_impl,piece_local,(download_priority_t)0x1);
  }
  ::std::
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ::erase(&this->m_time_critical_pieces,__position);
  return;
}

Assistant:

void torrent::remove_time_critical_piece(piece_index_t const piece, bool const finished)
	{
		for (auto i = m_time_critical_pieces.begin(), end(m_time_critical_pieces.end());
			i != end; ++i)
		{
			if (i->piece != piece) continue;
			if (finished)
			{
				if (i->flags & torrent_handle::alert_when_available)
				{
					read_piece(i->piece);
				}

				// if first_requested is min_time(), it wasn't requested as a critical piece
				// and we shouldn't adjust any average download times
				if (i->first_requested != min_time())
				{
					// update the average download time and average
					// download time deviation
					int const dl_time = aux::numeric_cast<int>(total_milliseconds(aux::time_now() - i->first_requested));

					if (m_average_piece_time == 0)
					{
						m_average_piece_time = dl_time;
					}
					else
					{
						int diff = std::abs(dl_time - m_average_piece_time);
						if (m_piece_time_deviation == 0) m_piece_time_deviation = diff;
						else m_piece_time_deviation = (m_piece_time_deviation * 9 + diff) / 10;

						m_average_piece_time = (m_average_piece_time * 9 + dl_time) / 10;
					}
				}
			}
			else if (i->flags & torrent_handle::alert_when_available)
			{
				// post an empty read_piece_alert to indicate it failed
				alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			if (has_picker()) m_picker->set_piece_priority(piece, low_priority);
			m_time_critical_pieces.erase(i);
			return;
		}
	}